

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall Fossilize::StreamArchive::prepare(StreamArchive *this)

{
  Impl *pIVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  int iVar5;
  LogLevel LVar6;
  FILE *__stream;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong __off;
  char *__modes;
  pointer __filename;
  ulong uVar10;
  ResourceTag tag;
  ulong uVar11;
  uint8_t magic [16];
  uint64_t value;
  char bytes_to_read [56];
  ulong local_100;
  undefined7 local_f8;
  undefined1 uStack_f1;
  undefined7 uStack_f0;
  char local_e9;
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *local_e8;
  ulonglong local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  pIVar1 = (this->super_DatabaseInterface).impl;
  ppEVar2 = (pIVar1->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar3 = (pIVar1->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)ppEVar2 - (long)ppEVar3) || this->mode != ReadOnly && ppEVar2 != ppEVar3) {
    return false;
  }
  switch(this->mode) {
  case Append:
    __stream = fopen((this->path)._M_dataplus._M_p,"r+b");
    this->file = (FILE *)__stream;
    if (__stream == (FILE *)0x0) goto switchD_001466da_caseD_3;
    goto LAB_00146732;
  case ReadOnly:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "rb";
    break;
  case AppendWithReadOnlyAccess:
    goto switchD_001466da_caseD_2;
  case OverWrite:
switchD_001466da_caseD_3:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "wb";
    break;
  case ExclusiveOverWrite:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "wbx";
    break;
  default:
    __stream = (FILE *)this->file;
    goto LAB_00146729;
  }
  __stream = fopen(__filename,__modes);
  this->file = (FILE *)__stream;
LAB_00146729:
  if (__stream == (FILE *)0x0) {
switchD_001466da_caseD_2:
    return false;
  }
LAB_00146732:
  pIVar1 = (this->super_DatabaseInterface).impl;
  ppEVar2 = (pIVar1->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 ==
      (pIVar1->imported_metadata).
      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (1 < this->mode - OverWrite) {
      iVar5 = fileno(__stream);
      iVar5 = posix_fadvise(iVar5,0,0,2);
      if (((iVar5 != 0) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
         (bVar4 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                            ), !bVar4)) {
        prepare();
      }
      fseek((FILE *)this->file,0,2);
      uVar7 = ftell((FILE *)this->file);
      rewind((FILE *)this->file);
      if ((uVar7 != 0) && ((shutdown_requested & 1) == 0)) {
        sVar8 = fread(&local_f8,1,0x10,(FILE *)this->file);
        if (sVar8 != 0x10) {
          return false;
        }
        if (CONCAT71(uStack_f0,uStack_f1) != 0x4244455a49 ||
            CONCAT17(uStack_f1,local_f8) != 0x494c4953534f4681) {
          return false;
        }
        if ((byte)(local_e9 - 7U) < 0xfe) {
          return false;
        }
        if (uVar7 < 0x11) {
          uVar10 = 0x10;
          local_100 = uVar7;
        }
        else {
          local_e8 = this->seen_blobs;
          uVar10 = 0x10;
          do {
            local_100 = uVar10;
            if ((shutdown_requested & 1) != 0) {
              return false;
            }
            uVar11 = local_100 + 0x38;
            if (uVar7 < uVar11) {
              LVar6 = get_thread_log_level();
              uVar10 = local_100;
              if ((int)LVar6 < 2) {
                bVar4 = Internal::log_thread_callback
                                  (LOG_DEFAULT,"Detected sliced file. Dropping entries from here.\n"
                                  );
                uVar11 = local_100;
LAB_00146a54:
                uVar10 = uVar11;
                if (bVar4 == false) {
                  fwrite("Fossilize WARN: Detected sliced file. Dropping entries from here.\n",0x42,
                         1,_stderr);
                }
              }
              break;
            }
            sVar8 = fread(local_68,1,0x38,(FILE *)this->file);
            if (sVar8 != 0x38) {
              return false;
            }
            __off = (ulong)local_40;
            uVar10 = uVar11 + __off;
            if (uVar7 < uVar10) {
              LVar6 = get_thread_log_level();
              uVar10 = uVar11;
              if ((int)LVar6 < 2) {
                bVar4 = Internal::log_thread_callback
                                  (LOG_DEFAULT,"Detected sliced file. Dropping entries from here.\n"
                                  );
                goto LAB_00146a54;
              }
              break;
            }
            local_98 = CONCAT44(uStack_3c,local_40);
            uStack_90 = uStack_38;
            local_a8 = 0;
            local_b8 = local_60;
            uStack_b0 = uStack_58;
            local_c8 = 0;
            local_d8 = local_50;
            uStack_d0 = uStack_48;
            uVar9 = strtoul((char *)&local_b8,(char **)0x0,0x10);
            tag = (ResourceTag)uVar9;
            if (tag < RESOURCE_COUNT) {
              local_e0 = strtoull((char *)&local_d8,(char **)0x0,0x10);
              local_78 = local_98;
              uStack_70 = uStack_90;
              local_80 = uVar11;
              bVar4 = DatabaseInterface::test_resource_filter
                                (&this->super_DatabaseInterface,tag,local_e0);
              if (bVar4) {
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<unsigned_long&,Fossilize::StreamArchive::Entry&>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)(local_e8 +
                              (tag & (RESOURCE_APPLICATION_BLOB_LINK|RESOURCE_COMPUTE_PIPELINE))),
                           &local_e0,&local_80);
              }
            }
            iVar5 = fseek((FILE *)this->file,__off,1);
            if (iVar5 < 0) {
              return false;
            }
          } while (uVar10 < uVar7);
        }
        if (((uVar10 != uVar7) && (this->mode == Append)) &&
           (iVar5 = fseek((FILE *)this->file,local_100,0), iVar5 < 0)) {
          return false;
        }
        goto LAB_0014685c;
      }
      __stream = (FILE *)this->file;
    }
    sVar8 = fwrite(&stream_reference_magic_and_version,1,0x10,__stream);
    if (sVar8 != 0x10) {
      return false;
    }
  }
  else {
    this->imported_metadata = *ppEVar2;
    iVar5 = fileno(__stream);
    iVar5 = posix_fadvise(iVar5,0,0,1);
    if (((iVar5 != 0) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
       (bVar4 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                          ), !bVar4)) {
      prepare();
    }
  }
LAB_0014685c:
  this->alive = true;
  return true;
}

Assistant:

bool prepare() override
	{
		if (!impl->imported_metadata.empty() && mode != DatabaseMode::ReadOnly)
			return false;
		if (impl->imported_metadata.size() > 1)
			return false;

		switch (mode)
		{
		case DatabaseMode::ReadOnly:
#if _WIN32
			{
				file = nullptr;
				int fd = _open(path.c_str(), _O_BINARY | _O_RDONLY |
				               (impl->imported_metadata.empty() ? _O_SEQUENTIAL : _O_RANDOM),
				               _S_IREAD);
				if (fd >= 0)
					file = _fdopen(fd, "rb");
			}
#else
			file = fopen(path.c_str(), "rb");
#endif
			break;

		case DatabaseMode::Append:
			file = fopen(path.c_str(), "r+b");
			// r+b on empty file does not seem to work on Windows, so just fall back to wb.
			if (!file)
				file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::AppendWithReadOnlyAccess:
			return false;

		case DatabaseMode::OverWrite:
			file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::ExclusiveOverWrite:
		{
#ifdef _WIN32
			file = nullptr;
			int fd = _open(path.c_str(), _O_BINARY | _O_WRONLY | _O_CREAT | _O_EXCL | _O_TRUNC | _O_SEQUENTIAL, _S_IWRITE | _S_IREAD);
			if (fd >= 0)
				file = _fdopen(fd, "wb");
#else
			file = fopen(path.c_str(), "wbx");
#endif
			break;
		}
		}

		if (!file)
			return false;

		if (!impl->imported_metadata.empty())
		{
			// Do nothing here. TODO: Set fadvise to RANDOM here.
			imported_metadata = impl->imported_metadata[0];
#ifdef __linux__
			// We're going to be doing scattered reads, which hopefully have been cached earlier.
			// However, if the archive has been paged out, RANDOM is the correct approach,
			// since prefetching data is only detrimental.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_RANDOM) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif
		}
		else if (mode != DatabaseMode::OverWrite && mode != DatabaseMode::ExclusiveOverWrite)
		{
#if _WIN32
			if (mode == DatabaseMode::ReadOnly)
			{
				// Set the buffer size to reduce I/O cost of sparse freads
				setvbuf(file, nullptr, _IOFBF, FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw));
			}
#endif

#ifdef __linux__
			// We're going to scan through the archive sequentially to discover metadata, so some prefetching is welcome.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_SEQUENTIAL) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif

			// Scan through the archive and get the list of files.
			fseek(file, 0, SEEK_END);
			size_t len = ftell(file);
			rewind(file);

			if (len != 0 && !shutdown_requested.load(std::memory_order_relaxed))
			{
				uint8_t magic[MagicSize];
				if (fread(magic, 1, MagicSize, file) != MagicSize)
					return false;

				if (memcmp(magic, stream_reference_magic_and_version, MagicSize - 1))
					return false;
				int version = magic[MagicSize - 1];
				if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
					return false;

				size_t offset = MagicSize;
				size_t begin_append_offset = len;

				while (offset < len)
				{
					if (shutdown_requested.load(std::memory_order_relaxed))
						return false;

					begin_append_offset = offset;

					PayloadHeaderRaw *header_raw = nullptr;
					char bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw)];
					PayloadHeader header = {};

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + sizeof(bytes_to_read) > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					// NAME + HEADER in one read
					if (fread(bytes_to_read, 1, sizeof(bytes_to_read), file) != sizeof(bytes_to_read))
						return false;
					offset += sizeof(bytes_to_read);
					header_raw = (PayloadHeaderRaw*)&bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH];
					convert_from_le(header, *header_raw);

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + header.payload_size > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					char tag_str[16 + 1] = {};
					char value_str[16 + 1] = {};
					memcpy(tag_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
					memcpy(value_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

					auto tag = unsigned(strtoul(tag_str, nullptr, 16));
					if (tag < RESOURCE_COUNT)
					{
						uint64_t value = strtoull(value_str, nullptr, 16);
						Entry entry = {};
						entry.header = header;
						entry.offset = offset;
						if (test_resource_filter(static_cast<ResourceTag>(tag), value))
							seen_blobs[tag].emplace(value, entry);
					}

					if (fseek(file, header.payload_size, SEEK_CUR) < 0)
						return false;

					offset += header.payload_size;
				}

				if (mode == DatabaseMode::Append && offset != len)
				{
					if (fseek(file, begin_append_offset, SEEK_SET) < 0)
						return false;
				}
			}
			else
			{
				// Appending to a fresh file. Make sure we have the magic.
				if (fwrite(stream_reference_magic_and_version, 1,
				           sizeof(stream_reference_magic_and_version), file) != sizeof(stream_reference_magic_and_version))
					return false;
			}
		}
		else
		{
			if (fwrite(stream_reference_magic_and_version, 1, sizeof(stream_reference_magic_and_version), file) !=
			    sizeof(stream_reference_magic_and_version))
			{
				return false;
			}
		}

		alive = true;
		return true;
	}